

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_addclause(sat_solver *s,lit *begin,lit *end)

{
  uint *pEnd;
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6ca,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar3 = (uint *)begin;
  if (s->fPrintClause != 0) {
    do {
      pcVar9 = "!";
      if ((*puVar3 & 1) == 0) {
        pcVar9 = "";
      }
      printf("%s%d ",pcVar9,(ulong)(uint)((int)*puVar3 >> 1));
      puVar3 = puVar3 + 1;
    } while (puVar3 < end);
    putchar(10);
  }
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  puVar3 = (uint *)(s->temp_clause).ptr;
  do {
    uVar7 = *begin;
    uVar8 = (s->temp_clause).size;
    if (uVar8 == (s->temp_clause).cap) {
      iVar2 = (uVar8 >> 1) * 3;
      if ((int)uVar8 < 4) {
        iVar2 = uVar8 * 2;
      }
      if (puVar3 == (uint *)0x0) {
        puVar3 = (uint *)malloc((long)iVar2 << 2);
      }
      else {
        puVar3 = (uint *)realloc(puVar3,(long)iVar2 << 2);
      }
      (s->temp_clause).ptr = (int *)puVar3;
      if (puVar3 == (uint *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->temp_clause).cap * 9.5367431640625e-07,
               (double)iVar2 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      (s->temp_clause).cap = iVar2;
      uVar8 = (s->temp_clause).size;
    }
    (s->temp_clause).size = uVar8 + 1;
    puVar3[(int)uVar8] = uVar7;
    begin = (lit *)((uint *)begin + 1);
  } while (begin < end);
  iVar2 = (s->temp_clause).size;
  iVar6 = (int)*puVar3 >> 1;
  pEnd = puVar3 + iVar2;
  if (1 < (long)iVar2) {
    puVar4 = puVar3 + 1;
    do {
      uVar7 = *puVar4;
      puVar5 = puVar4;
      iVar1 = (int)uVar7 >> 1;
      if ((int)uVar7 >> 1 <= iVar6) {
        iVar1 = iVar6;
      }
      for (; (iVar6 = iVar1, puVar3 < puVar5 && ((int)uVar7 < (int)puVar5[-1]));
          puVar5 = puVar5 + -1) {
        *puVar5 = puVar5[-1];
        iVar1 = iVar6;
      }
      *puVar5 = uVar7;
      puVar4 = puVar4 + 1;
    } while (puVar4 < pEnd);
  }
  sat_solver_setnvars(s,iVar6 + 1);
  if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
     (iVar6 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)puVar3,(lit *)pEnd), iVar6 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x6e8,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  iVar6 = 0;
  if (0 < iVar2) {
    uVar7 = 0xfffffffe;
    puVar4 = puVar3;
    puVar5 = puVar3;
    do {
      uVar8 = *puVar4;
      if (((uVar8 ^ uVar7) == 1) || ((uVar8 & 1) == (int)s->assigns[(int)uVar8 >> 1]))
      goto LAB_00556770;
      if (s->assigns[(int)uVar8 >> 1] == '\x03' && uVar8 != uVar7) {
        *puVar5 = uVar8;
        puVar5 = puVar5 + 1;
        uVar7 = uVar8;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < pEnd);
    if (puVar5 != puVar3) {
      if ((long)puVar5 - (long)puVar3 == 4) {
        uVar7 = *puVar3;
        iVar2 = (int)uVar7 >> 1;
        if (s->pFreqs[iVar2] == '\0') {
          s->pFreqs[iVar2] = '\x01';
        }
        uVar8 = (uint)s->assigns[iVar2];
        if (uVar8 != 3) {
          return (uint)((uVar7 & 1) == uVar8);
        }
        s->assigns[iVar2] = (byte)uVar7 & 1;
        s->levels[iVar2] = (s->trail_lim).size;
        s->reasons[iVar2] = 0;
        iVar2 = s->qtail;
        s->qtail = iVar2 + 1;
        s->trail[iVar2] = uVar7;
      }
      else {
        sat_solver_clause_new(s,(lit *)puVar3,(lit *)puVar5,0);
      }
LAB_00556770:
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int sat_solver_addclause(sat_solver* s, lit* begin, lit* end)
{
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( s->fPrintClause )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver_setnvars(s,maxvar+1);

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver_enqueue(s,*begin,0);

    // create new clause
    sat_solver_clause_new(s,begin,j,0);
    return true;
}